

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O3

void anon_unknown.dwarf_71875::replace(string *str,string *keyword,subst *fn)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  runtime_error *this;
  long *plVar7;
  string prefix;
  string suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> mod;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> replace;
  long *local_d8;
  long local_c8;
  long lStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  _Any_data *local_58;
  string local_50;
  
  local_58 = (_Any_data *)fn;
  std::operator+(&local_b8,"{",keyword);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_d8 = &local_c8;
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_c8 = *plVar7;
    lStack_c0 = plVar3[3];
  }
  else {
    local_c8 = *plVar7;
    local_d8 = (long *)*plVar3;
  }
  lVar1 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"}","");
  uVar4 = std::__cxx11::string::find((char *)str,(ulong)local_d8,0);
  if (uVar4 != 0xffffffffffffffff) {
    do {
      uVar5 = std::__cxx11::string::find((char *)str,(ulong)local_b8._M_dataplus._M_p,lVar1 + uVar4)
      ;
      if (uVar5 == 0xffffffffffffffff) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Invalid pattern");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar6 = std::__cxx11::string::find((char)str,0x7c);
      std::__cxx11::string::substr((ulong)&local_98,(ulong)str);
      if (*(long *)(local_58 + 1) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(local_58->_M_pod_data + 0x18))(&local_78,local_58,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (uVar6 < uVar5) {
        std::__cxx11::string::substr((ulong)&local_98,(ulong)str);
        iVar2 = std::__cxx11::string::compare((char *)&local_98);
        if (iVar2 == 0) {
          util::toUpper(&local_50,&local_78);
LAB_00168132:
          std::__cxx11::string::operator=((string *)&local_78,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_98);
          if (iVar2 == 0) {
            util::toLower(&local_50,&local_78);
            goto LAB_00168132;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::replace
                ((ulong)str,uVar4,(char *)((uVar5 - uVar4) + 1),(ulong)local_78._M_dataplus._M_p);
      uVar4 = uVar4 + local_78._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      uVar4 = std::__cxx11::string::find((char *)str,(ulong)local_d8,uVar4);
    } while (uVar4 != 0xffffffffffffffff);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  return;
}

Assistant:

void replace(std::string& str, const std::string& keyword, subst fn) {
  std::string::size_type lpos = 0u;
  std::string::size_type rpos = 0u;
  const std::string prefix = "{" + keyword + ":";
  const std::string suffix = "}";
  while ((lpos = str.find(prefix, lpos)) != std::string::npos) {
    // Find corresponding suffix
    rpos = str.find(suffix, lpos + prefix.length());
    if (rpos == std::string::npos) {
      throw std::runtime_error("Invalid pattern");
    }

    // Lookup modifier (if any)
    auto mlpos = str.find('|', lpos + prefix.length());
    auto mrpos = rpos;
    auto mok = (mlpos != std::string::npos && mlpos < rpos);

    // Lookup replacement
    auto klpos = lpos + prefix.length();
    auto krpos = mok ? mlpos : rpos;
    auto replace = fn(str.substr(klpos, krpos - klpos));

    // Apply modifier (if applicable)
    if (mok) {
      auto mod = str.substr(mlpos + 1, mrpos - (mlpos + 1));
      if (mod == "upper") {
        replace = toUpper(replace);
      } else if (mod == "lower") {
        replace = toLower(replace);
      }
    }

    // Replace
    str.replace(lpos, rpos - lpos + 1, replace);
    lpos += replace.length();
  }
}